

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallNormalHeapBucket.cpp
# Opt level: O2

void __thiscall
Memory::SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_>::
SweepPendingObjects(SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_>
                    *this,RecyclerSweep *recyclerSweep)

{
  SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *list;
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  Recycler *recycler;
  SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *pSVar4;
  undefined4 *puVar5;
  anon_class_16_2_03c8067a fn;
  
  bVar2 = RecyclerSweep::IsBackground(recyclerSweep);
  HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_>::VerifyHeapBlockCount
            (&this->
              super_HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_>,
             bVar2);
  uVar3 = HeapBucket::GetBucketIndex((HeapBucket *)this);
  list = (recyclerSweep->normalData).bucketData[uVar3].pendingSweepList;
  recycler = RecyclerSweep::GetRecycler(recyclerSweep);
  if (list != (SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
    bVar2 = recycler->inPartialCollectMode;
    (recyclerSweep->normalData).bucketData[uVar3].pendingSweepList =
         (SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
    if (bVar2 == true) {
      fn.recycler = recycler;
      fn.this = this;
      HeapBlockList::
      ForEachEditing<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>,Memory::SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>>::SweepPendingObjects(Memory::RecyclerSweep&)::_lambda(Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>*)_1_>
                (list,fn);
    }
    else {
      pSVar4 = SweepPendingObjects<(Memory::SweepMode)1>(this,recycler,list);
      (pSVar4->super_SmallHeapBlockT<SmallAllocationBlockAttributes>).next =
           &((this->
             super_HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_>).
            heapBlockList)->super_SmallHeapBlockT<SmallAllocationBlockAttributes>;
      (this->super_HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_>).
      heapBlockList = list;
      HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_>::
      StartAllocationAfterSweep
                (&this->
                  super_HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_>)
      ;
    }
    bVar2 = RecyclerSweep::IsBackground(recyclerSweep);
    HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_>::
    VerifyHeapBlockCount
              (&this->
                super_HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_>,
               bVar2);
  }
  bVar2 = HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_>::
          IsAllocationStopped(&this->
                               super_HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_>
                             );
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                       ,0x137,"(!this->IsAllocationStopped())","!this->IsAllocationStopped()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  return;
}

Assistant:

void
SmallNormalHeapBucketBase<TBlockType>::SweepPendingObjects(RecyclerSweep& recyclerSweep)
{
    RECYCLER_SLOW_CHECK(this->VerifyHeapBlockCount(recyclerSweep.IsBackground()));

    CompileAssert(!BaseT::IsLeafBucket);
    TBlockType *& pendingSweepList = recyclerSweep.GetPendingSweepBlockList(this);
    TBlockType * const list = pendingSweepList;
    Recycler * const recycler = recyclerSweep.GetRecycler();
#if ENABLE_PARTIAL_GC
    bool const partialSweep = recycler->inPartialCollectMode;
#endif
    if (list)
    {
        pendingSweepList = nullptr;
#if ENABLE_PARTIAL_GC
        if (partialSweep)
        {
            // We did a partial sweep.
            // Blocks in the pendingSweepList are the ones we decided not to reuse.

            HeapBlockList::ForEachEditing(list, [this, recycler](TBlockType * heapBlock)
            {
                // We are not going to reuse this block.
                // SweepMode_ConcurrentPartial will not actually collect anything, it will just update some state.
                // The sweepable objects will be collected in a future Sweep.

                // Note, page heap blocks are never swept concurrently
#ifdef RECYCLER_TRACE
                recycler->PrintBlockStatus(this, heapBlock, _u("[**17**] calling SweepObjects."));
#endif
                heapBlock->template SweepObjects<SweepMode_ConcurrentPartial>(recycler);

                // page heap mode should never reach here, so don't check pageheap enabled or not
                DebugOnly(this->AssertCheckHeapBlockNotInAnyList(heapBlock));
                if (heapBlock->HasFreeObject())
                {
                    AssertMsg(!HeapBlockList::Contains(heapBlock, partialSweptHeapBlockList), "The heap block already exists in the partialSweptHeapBlockList.");
                    // We have pre-existing free objects, so put this in the partialSweptHeapBlockList
                    heapBlock->SetNextBlock(this->partialSweptHeapBlockList);
                    this->partialSweptHeapBlockList = heapBlock;
#ifdef RECYCLER_TRACE
                    this->GetRecycler()->PrintBlockStatus(this, heapBlock, _u("[**21**] finished SweepPendingObjects, heapblock added to partialSweptHeapBlockList."));
#endif
                }
                else
                {
                    // No free objects, so put in the fullBlockList
                    heapBlock->SetNextBlock(this->fullBlockList);
                    this->fullBlockList = heapBlock;
#ifdef RECYCLER_TRACE
                    this->GetRecycler()->PrintBlockStatus(this, heapBlock, _u("[**22**] finished SweepPendingObjects, heapblock FULL added to fullBlockList."));
#endif
                }
            });
        }
        else
#endif
        {
            // We decided not to do a partial sweep.
            // Blocks in the pendingSweepList need to have a regular sweep.

#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP && SUPPORT_WIN32_SLIST
            if (CONFIG_FLAG_RELEASE(EnableConcurrentSweepAlloc))
            {
                if (this->AllowAllocationsDuringConcurrentSweep() && !this->AllocationsStartedDuringConcurrentSweep())
                {
                    Assert(!this->IsAnyFinalizableBucket());
                    this->StartAllocationDuringConcurrentSweep();
                }
            }
#endif

            TBlockType * tail = SweepPendingObjects<SweepMode_Concurrent>(recycler, list);

#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP && SUPPORT_WIN32_SLIST
            // During concurrent sweep if allocations were allowed, the heap blocks directly go into the SLIST of
            // allocable heap blocks. They will be returned to the heapBlockList at the end of the sweep.
            if (!this->AllowAllocationsDuringConcurrentSweep())
#endif
            {
                tail->SetNextBlock(this->heapBlockList);
                this->heapBlockList = list;

                this->StartAllocationAfterSweep();
            }
        }

        RECYCLER_SLOW_CHECK(this->VerifyHeapBlockCount(recyclerSweep.IsBackground()));
    }

    Assert(!this->IsAllocationStopped());
}